

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O1

void __thiscall
QHashPrivate::Data<QHashPrivate::Node<QFontEngine::FaceId,_QFontSubset_*>_>::Data
          (Data<QHashPrivate::Node<QFontEngine::FaceId,_QFontSubset_*>_> *this,
          Data<QHashPrivate::Node<QFontEngine::FaceId,_QFontSubset_*>_> *other)

{
  byte bVar1;
  Span *pSVar2;
  Entry *pEVar3;
  Data *pDVar4;
  undefined8 uVar5;
  QMapData<std::map<QFont::Tag,_float,_std::less<QFont::Tag>,_std::allocator<std::pair<const_QFont::Tag,_float>_>_>_>
  *pQVar6;
  Node<QFontEngine::FaceId,_QFontSubset_*> *pNVar7;
  long lVar8;
  size_t sVar9;
  size_t sVar10;
  ulong uVar11;
  R RVar12;
  
  (this->ref).atomic._q_value.super___atomic_base<int>._M_i = 1;
  this->size = other->size;
  sVar9 = other->numBuckets;
  sVar10 = other->seed;
  this->numBuckets = other->numBuckets;
  this->seed = sVar10;
  this->spans = (Span *)0x0;
  RVar12 = allocateSpans(sVar9);
  this->spans = (Span *)RVar12.spans;
  if (RVar12.nSpans != 0) {
    lVar8 = 0;
    sVar9 = 0;
    do {
      pSVar2 = other->spans;
      sVar10 = 0;
      do {
        bVar1 = pSVar2->offsets[sVar10 + lVar8];
        if (bVar1 != 0xff) {
          pEVar3 = pSVar2[sVar9].entries;
          uVar11 = (ulong)((uint)bVar1 * 0x50);
          pNVar7 = Span<QHashPrivate::Node<QFontEngine::FaceId,_QFontSubset_*>_>::insert
                             (this->spans + sVar9,sVar10);
          pDVar4 = *(Data **)((pEVar3->storage).data + uVar11);
          (pNVar7->key).filename.d.d = pDVar4;
          (pNVar7->key).filename.d.ptr = *(char **)((pEVar3->storage).data + uVar11 + 8);
          (pNVar7->key).filename.d.size = *(qsizetype *)((pEVar3->storage).data + uVar11 + 0x10);
          if (pDVar4 != (Data *)0x0) {
            LOCK();
            (pDVar4->super_QArrayData).ref_._q_value =
                 (Type)((int)(pDVar4->super_QArrayData).ref_._q_value + 1);
            UNLOCK();
          }
          pDVar4 = *(Data **)((pEVar3->storage).data + uVar11 + 0x18);
          (pNVar7->key).uuid.d.d = pDVar4;
          (pNVar7->key).uuid.d.ptr = *(char **)((pEVar3->storage).data + uVar11 + 0x20);
          (pNVar7->key).uuid.d.size = *(qsizetype *)((pEVar3->storage).data + uVar11 + 0x28);
          if (pDVar4 != (Data *)0x0) {
            LOCK();
            (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
            UNLOCK();
          }
          (pNVar7->key).encoding = *(int *)((pEVar3->storage).data + uVar11 + 0x38);
          uVar5 = *(undefined8 *)((pEVar3->storage).data + uVar11 + 0x30);
          (pNVar7->key).index = (int)uVar5;
          (pNVar7->key).instanceIndex = (int)((ulong)uVar5 >> 0x20);
          pQVar6 = *(QMapData<std::map<QFont::Tag,_float,_std::less<QFont::Tag>,_std::allocator<std::pair<const_QFont::Tag,_float>_>_>_>
                     **)((pEVar3->storage).data + uVar11 + 0x40);
          (pNVar7->key).variableAxes.d.d.ptr = pQVar6;
          if (pQVar6 != (QMapData<std::map<QFont::Tag,_float,_std::less<QFont::Tag>,_std::allocator<std::pair<const_QFont::Tag,_float>_>_>_>
                         *)0x0) {
            LOCK();
            (pQVar6->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>
            ._q_value = (Type)((int)(pQVar6->super_QSharedData).ref.super_QAtomicInteger<int>.
                                    super_QBasicAtomicInteger<int>._q_value + 1);
            UNLOCK();
          }
          pNVar7->value = *(QFontSubset **)((pEVar3->storage).data + uVar11 + 0x48);
        }
        sVar10 = sVar10 + 1;
      } while (sVar10 != 0x80);
      sVar9 = sVar9 + 1;
      lVar8 = lVar8 + 0x90;
    } while (sVar9 != RVar12.nSpans);
  }
  return;
}

Assistant:

Data(const Data &other) : size(other.size), numBuckets(other.numBuckets), seed(other.seed)
    {
        auto r = allocateSpans(numBuckets);
        spans = r.spans;
        reallocationHelper<false>(other, r.nSpans);
    }